

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  StringMapEntryBase *pSVar1;
  StringRef LHS;
  bool bVar2;
  StringMapEntryBase *pSVar3;
  char *data;
  size_t length;
  uint32_t in_ECX;
  StringRef Buffer;
  StringRef local_88;
  StringMapImpl *local_78;
  char *local_70;
  char *local_68;
  char *ItemStr;
  StringMapEntryBase *BucketItem;
  int FirstTombstone;
  uint ProbeAmt;
  uint *HashTable;
  StringMapImpl *pSStack_40;
  uint BucketNo;
  char *local_38;
  uint32_t local_30;
  uint local_2c;
  uint FullHashValue;
  uint HTSize;
  StringMapImpl *this_local;
  StringRef Name_local;
  
  Name_local.Data = (char *)Name.Length;
  this_local = (StringMapImpl *)Name.Data;
  local_2c = this->NumBuckets;
  _FullHashValue = this;
  if (local_2c == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    local_2c = this->NumBuckets;
  }
  pSStack_40 = this_local;
  local_38 = Name_local.Data;
  Buffer.Length = 0;
  Buffer.Data = Name_local.Data;
  local_30 = djbHash((llvm *)this_local,Buffer,in_ECX);
  HashTable._4_4_ = local_30 & local_2c - 1;
  _FirstTombstone = this->TheTable + (ulong)this->NumBuckets + 1;
  BucketItem._4_4_ = 1;
  BucketItem._0_4_ = 0xffffffff;
  do {
    pSVar1 = this->TheTable[HashTable._4_4_];
    if (pSVar1 == (StringMapEntryBase *)0x0) {
      if ((uint)BucketItem == 0xffffffff) {
        *(uint32_t *)((long)_FirstTombstone + (ulong)HashTable._4_4_ * 4) = local_30;
        Name_local.Length._4_4_ = HashTable._4_4_;
      }
      else {
        *(uint32_t *)((long)_FirstTombstone + (long)(int)(uint)BucketItem * 4) = local_30;
        Name_local.Length._4_4_ = (uint)BucketItem;
      }
      return Name_local.Length._4_4_;
    }
    ItemStr = (char *)pSVar1;
    pSVar3 = getTombstoneVal();
    if (pSVar1 == pSVar3) {
      if ((uint)BucketItem == 0xffffffff) {
        BucketItem._0_4_ = HashTable._4_4_;
      }
    }
    else if (*(uint32_t *)((long)_FirstTombstone + (ulong)HashTable._4_4_ * 4) == local_30) {
      data = ItemStr + this->ItemSize;
      local_78 = this_local;
      local_70 = Name_local.Data;
      local_68 = data;
      length = StringMapEntryBase::getKeyLength((StringMapEntryBase *)ItemStr);
      StringRef::StringRef(&local_88,data,length);
      LHS.Length = (size_t)local_70;
      LHS.Data = (char *)local_78;
      bVar2 = llvm::operator==(LHS,local_88);
      if (bVar2) {
        return HashTable._4_4_;
      }
    }
    HashTable._4_4_ = HashTable._4_4_ + BucketItem._4_4_ & local_2c - 1;
    BucketItem._4_4_ = BucketItem._4_4_ + 1;
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}